

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O1

void ps_default_search_args(ps_config_t *config)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *__s;
  FILE *__stream;
  ulong size;
  char *pcVar5;
  
  pcVar2 = getenv("POCKETSPHINX_PATH");
  pcVar5 = "/usr/local/share/pocketsphinx/model";
  if (pcVar2 != (char *)0x0) {
    pcVar5 = pcVar2;
  }
  pcVar2 = ps_config_str(config,"hmm");
  pcVar3 = ps_config_str(config,"lm");
  pcVar4 = ps_config_str(config,"dict");
  iVar1 = snprintf((char *)0x0,0,"%s/en-us/cmudict-en-us.dict",pcVar5);
  if (-1 < iVar1) {
    size = (ulong)(iVar1 + 1);
    __s = (char *)__ckd_malloc__(size,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                 ,0xba);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0xbc,"Looking for default model in %s\n",pcVar5);
    snprintf(__s,size,"%s/en-us/en-us",pcVar5);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = string_join(__s,"/means",0);
      __stream = fopen(pcVar2,"rb");
      if (__stream == (FILE *)0x0) {
        ckd_free(pcVar2);
      }
      else {
        fclose(__stream);
        ckd_free(pcVar2);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                ,0xc0,"Loading default acoustic model from %s\n",__s);
        ps_config_set_str(config,"hmm",__s);
      }
    }
    snprintf(__s,size,"%s/en-us/en-us.lm.bin",pcVar5);
    if (pcVar3 == (char *)0x0) {
      pcVar2 = ps_config_str(config,"fsg");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = ps_config_str(config,"jsgf");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = ps_config_str(config,"lmctl");
          if (pcVar2 == (char *)0x0) {
            pcVar2 = ps_config_str(config,"kws");
            if (pcVar2 == (char *)0x0) {
              pcVar2 = ps_config_str(config,"keyphrase");
              if (pcVar2 == (char *)0x0) {
                iVar1 = file_exists(__s);
                if (iVar1 != 0) {
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                          ,0xcc,"Loading default language model from %s\n",__s);
                  ps_config_set_str(config,"lm",__s);
                }
              }
            }
          }
        }
      }
    }
    snprintf(__s,size,"%s/en-us/cmudict-en-us.dict",pcVar5);
    if (pcVar4 == (char *)0x0) {
      iVar1 = file_exists(__s);
      if (iVar1 != 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                ,0xd3,"Loading default dictionary from %s\n",__s);
        ps_config_set_str(config,"dict",__s);
      }
    }
    ckd_free(__s);
    return;
  }
  err_msg_system(ERR_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                 ,0xb9,"snprintf() failed, giving up all hope");
  exit(1);
}

Assistant:

void
ps_default_search_args(ps_config_t *config)
{
    const char *modeldir = ps_default_modeldir();

    if (modeldir) {
        const char *hmmdir = ps_config_str(config, "hmm");
        const char *lmfile = ps_config_str(config, "lm");
        const char *dictfile = ps_config_str(config, "dict");
        int maxlen;
        char *path;
    
        maxlen = snprintf(NULL, 0, "%s/en-us/cmudict-en-us.dict", modeldir);
        if (maxlen < 0)
            E_FATAL_SYSTEM("snprintf() failed, giving up all hope");
        path = ckd_malloc(++maxlen);

        E_INFO("Looking for default model in %s\n", modeldir);
        snprintf(path, maxlen, "%s/en-us/en-us", modeldir);
        if (hmmdir == NULL && hmmdir_exists(path)) {
            hmmdir = path;
            E_INFO("Loading default acoustic model from %s\n", hmmdir);
            ps_config_set_str(config, "hmm", hmmdir);
        }

        snprintf(path, maxlen, "%s/en-us/en-us.lm.bin", modeldir);
        if (lmfile == NULL && !ps_config_str(config, "fsg")
            && !ps_config_str(config, "jsgf")
            && !ps_config_str(config, "lmctl")
            && !ps_config_str(config, "kws")
            && !ps_config_str(config, "keyphrase")
            && file_exists(path)) {
            lmfile = path;
            E_INFO("Loading default language model from %s\n", lmfile);
            ps_config_set_str(config, "lm", lmfile);
        }

        snprintf(path, maxlen, "%s/en-us/cmudict-en-us.dict", modeldir);
        if (dictfile == NULL && file_exists(path)) {
            dictfile = path;
            E_INFO("Loading default dictionary from %s\n", dictfile);
            ps_config_set_str(config, "dict", dictfile);
        }
        ckd_free(path);
    }
    else
        E_INFO("No system default model directory exists "
               "and POCKETSPHINX_PATH is not set."
               "(Python users can probably ignore this message)\n");
}